

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O1

void __thiscall
SparseArray_InitializeWithIndexAndValue_Test<pstore::uint128>::TestBody
          (SparseArray_InitializeWithIndexAndValue_Test<pstore::uint128> *this)

{
  sparse_array<int,pstore::uint128> *this_00;
  int *piVar1;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var2;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  extraout_RDX_05;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_17;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_19;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_20;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_22;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_23;
  pointer *__ptr;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr_1;
  bool bVar4;
  AssertionResult AVar5;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  unique_ptr<pstore::sparse_array<int,_pstore::uint128>,_std::default_delete<pstore::sparse_array<int,_pstore::uint128>_>_>
  arrp;
  AssertHelper local_68;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  undefined8 local_58;
  AssertHelper local_50;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  sparse_array<int,pstore::uint128> *local_20;
  
  local_48 = (undefined1  [8])0x0;
  pbStack_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_38._M_allocated_capacity = 4;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x200000001;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(local_58._4_4_,3);
  pstore::sparse_array<int,pstore::uint128>::make_unique<unsigned_long_const*,int_const*>
            ((sparse_array<int,pstore::uint128> *)&local_20,(unsigned_long *)local_48,
             (unsigned_long *)(local_38._M_local_buf + 8),(int *)&local_60,
             (int *)((long)&local_58 + 4));
  this_00 = local_20;
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (POPCOUNT(*(undefined8 *)local_20) + POPCOUNT(*(undefined8 *)(local_20 + 8)));
  local_68.data_._0_4_ = 3;
  AVar5 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                    ((internal *)local_48,"arr.size ()","3U",(unsigned_long *)&local_60,
                     (uint *)&local_68);
  _Var2._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar5.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x59,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    _Var2 = extraout_RDX.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
      _Var2._M_head_impl = extraout_RDX_00;
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
    _Var2._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_60._M_head_impl._1_7_,(char)*(ulong *)this_00) & 0xffffffffffffff01);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(ulong *)this_00 & 1) == 0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"arr.has_index (0)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x5a,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    _Var2._M_head_impl = extraout_RDX_02;
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      _Var2._M_head_impl = extraout_RDX_03;
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
      _Var2._M_head_impl = extraout_RDX_04;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    _Var2._M_head_impl = extraout_RDX_05._M_head_impl;
  }
  bVar4 = ((byte)*this_00 & 2) == 0;
  local_60._M_head_impl._0_1_ = bVar4;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"arr.has_index (1)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x5b,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    _Var2._M_head_impl = extraout_RDX_06;
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      _Var2._M_head_impl = extraout_RDX_07;
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
      _Var2._M_head_impl = extraout_RDX_08;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    _Var2._M_head_impl = extraout_RDX_09;
  }
  local_60._M_head_impl._0_1_ = (char)(((uint)*(ulong *)this_00 & 4) >> 2);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((*(ulong *)this_00 & 4) == 0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"arr.has_index (2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x5c,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    _Var2._M_head_impl = extraout_RDX_10;
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      _Var2._M_head_impl = extraout_RDX_11;
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
      _Var2._M_head_impl = extraout_RDX_12;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    _Var2._M_head_impl = extraout_RDX_13;
  }
  bVar4 = ((byte)*this_00 & 8) == 0;
  local_60._M_head_impl._0_1_ = bVar4;
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_48,(internal *)&local_60,(AssertionResult *)"arr.has_index (3)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x5d,(char *)local_48);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    _Var2._M_head_impl = extraout_RDX_14;
    if (local_48 != (undefined1  [8])&local_38) {
      operator_delete((void *)local_48,local_38._M_allocated_capacity + 1);
      _Var2._M_head_impl = extraout_RDX_15;
    }
    if ((long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,local_68.data_._0_4_) + 8))();
      _Var2._M_head_impl = extraout_RDX_16;
    }
  }
  if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,local_58);
    _Var2._M_head_impl = extraout_RDX_17;
  }
  piVar1 = pstore::sparse_array<int,pstore::uint128>::
           index_impl<pstore::sparse_array<int,pstore::uint128>&,int>
                     (this_00,(sparse_array<int,_pstore::uint128> *)0x0,
                      (size_type)_Var2._M_head_impl);
  local_60._M_head_impl._0_4_ = 1;
  AVar5 = testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_48,"arr[0]","1",piVar1,(int *)&local_60);
  _Var2._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar5.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x5f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    _Var2 = extraout_RDX_18.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
      _Var2._M_head_impl = extraout_RDX_19;
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
    _Var2._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_20.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  piVar1 = pstore::sparse_array<int,pstore::uint128>::
           index_impl<pstore::sparse_array<int,pstore::uint128>&,int>
                     (this_00,(sparse_array<int,_pstore::uint128> *)0x2,
                      (size_type)_Var2._M_head_impl);
  local_60._M_head_impl._0_4_ = 2;
  AVar5 = testing::internal::CmpHelperEQ<int,int>
                    ((internal *)local_48,"arr[2]","2",piVar1,(int *)&local_60);
  _Var2._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar5.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    _Var2 = extraout_RDX_21.
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl;
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
      _Var2._M_head_impl = extraout_RDX_22;
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
    _Var2._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_23.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  piVar1 = pstore::sparse_array<int,pstore::uint128>::
           index_impl<pstore::sparse_array<int,pstore::uint128>&,int>
                     (this_00,(sparse_array<int,_pstore::uint128> *)&DAT_00000004,
                      (size_type)_Var2._M_head_impl);
  local_60._M_head_impl._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>((internal *)local_48,"arr[4]","3",piVar1,(int *)&local_60)
  ;
  if (local_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_60);
    if (pbStack_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (pbStack_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sparse_array.cpp"
               ,0x61,pcVar3);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if (local_60._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_head_impl + 8))();
    }
  }
  if (pbStack_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_40,pbStack_40);
  }
  if (local_20 != (sparse_array<int,pstore::uint128> *)0x0) {
    operator_delete(local_20);
  }
  return;
}

Assistant:

TYPED_TEST (SparseArray, InitializeWithIndexAndValue) {
    auto arrp = sparse_array<int, TypeParam>::make_unique ({0, 2, 4}, {1, 2, 3});
    auto & arr = *arrp;

    EXPECT_EQ (arr.size (), 3U);
    EXPECT_TRUE (arr.has_index (0));
    EXPECT_FALSE (arr.has_index (1));
    EXPECT_TRUE (arr.has_index (2));
    EXPECT_FALSE (arr.has_index (3));
    EXPECT_FALSE (arr.has_index (256));
    EXPECT_EQ (arr[0], 1);
    EXPECT_EQ (arr[2], 2);
    EXPECT_EQ (arr[4], 3);
}